

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vktPipelineImageUtil.cpp
# Opt level: O2

deUint32 vkt::pipeline::getNextMultiple
                   (vector<unsigned_int,_std::allocator<unsigned_int>_> *divisors,deUint32 value)

{
  uint uVar1;
  uint *puVar2;
  size_t divNdx;
  long lVar3;
  uint uVar4;
  deUint32 nextMultiple;
  bool bVar5;
  
  puVar2 = (divisors->super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>)._M_impl.
           super__Vector_impl_data._M_start;
  while( true ) {
    bVar5 = true;
    for (lVar3 = 0;
        (long)(divisors->super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>)._M_impl.
              super__Vector_impl_data._M_finish - (long)puVar2 >> 2 != lVar3; lVar3 = lVar3 + 1) {
      if (bVar5) {
        bVar5 = value % puVar2[lVar3] == 0;
      }
      else {
        bVar5 = false;
      }
    }
    if (bVar5) break;
    uVar1 = value + 1;
    uVar4 = uVar1 % *puVar2;
    value = (value + *puVar2 + 1) - uVar4;
    if (uVar4 == 0) {
      value = uVar1;
    }
  }
  return value;
}

Assistant:

static deUint32 getNextMultiple (const std::vector<deUint32>& divisors, deUint32 value)
{
	deUint32	nextMultiple		= value;
	bool		nextMultipleFound	= false;

	while (true)
	{
		nextMultipleFound = true;

		for (size_t divNdx = 0; divNdx < divisors.size(); divNdx++)
			nextMultipleFound = nextMultipleFound && (nextMultiple % divisors[divNdx] == 0);

		if (nextMultipleFound)
			break;

		DE_ASSERT(nextMultiple < ~((deUint32)0u));
		nextMultiple = getNextMultiple(divisors[0], nextMultiple + 1);
	}

	return nextMultiple;
}